

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall
QTreeView::currentChanged(QTreeView *this,QModelIndex *current,QModelIndex *previous)

{
  long lVar1;
  bool bVar2;
  int chld;
  QTreeViewPrivate *this_00;
  ulong uVar3;
  QModelIndex *in_RDX;
  QModelIndex *in_RSI;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar4;
  QTreeViewPrivate *d_1;
  QTreeViewPrivate *d;
  QAccessibleEvent event;
  QWidget *in_stack_ffffffffffffff80;
  QTreeViewPrivate *this_01;
  undefined1 in_stack_ffffffffffffffc8 [16];
  undefined1 auVar5 [12];
  QTreeViewPrivate *in_stack_ffffffffffffffd8;
  
  auVar5 = in_stack_ffffffffffffffc8._4_12_;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QTreeView *)0x900f7a);
  QAbstractItemView::currentChanged((QAbstractItemView *)this_01,in_RSI,in_RDX);
  bVar2 = allColumnsShowFocus((QTreeView *)in_stack_ffffffffffffff80);
  if (bVar2) {
    bVar2 = QModelIndex::isValid((QModelIndex *)in_stack_ffffffffffffff80);
    if (bVar2) {
      in_stack_ffffffffffffff80 =
           QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff80);
      QVar4 = QTreeViewPrivate::visualRect(in_stack_ffffffffffffffd8,auVar5._4_8_,auVar5._0_4_);
      auVar5 = QVar4._4_12_;
      QWidget::update((QWidget *)in_RDI,(QRect *)in_stack_ffffffffffffff80);
    }
    bVar2 = QModelIndex::isValid((QModelIndex *)in_stack_ffffffffffffff80);
    if (bVar2) {
      QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff80);
      QTreeViewPrivate::visualRect(in_stack_ffffffffffffffd8,auVar5._4_8_,auVar5._0_4_);
      QWidget::update((QWidget *)in_RDI,(QRect *)in_stack_ffffffffffffff80);
    }
  }
  uVar3 = QAccessible::isActive();
  if ((((uVar3 & 1) != 0) &&
      (bVar2 = QModelIndex::isValid((QModelIndex *)in_stack_ffffffffffffff80), bVar2)) &&
     (bVar2 = QWidget::hasFocus((QWidget *)this_00), bVar2)) {
    d_func((QTreeView *)0x901076);
    QAccessibleEvent::QAccessibleEvent
              ((QAccessibleEvent *)&stack0xffffffffffffffd8,(QObject *)in_RDI,Focus);
    chld = QTreeViewPrivate::accessibleTree2Index(this_01,in_RSI);
    QAccessibleEvent::setChild((QAccessibleEvent *)&stack0xffffffffffffffd8,chld);
    QAccessible::updateAccessibility((QAccessibleEvent *)&stack0xffffffffffffffd8);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&stack0xffffffffffffffd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::currentChanged(const QModelIndex &current, const QModelIndex &previous)
{
    Q_D(QTreeView);
    QAbstractItemView::currentChanged(current, previous);

    if (allColumnsShowFocus()) {
        if (previous.isValid())
            viewport()->update(d->visualRect(previous, QTreeViewPrivate::FullRow));
        if (current.isValid())
            viewport()->update(d->visualRect(current, QTreeViewPrivate::FullRow));
    }
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive() && current.isValid() && hasFocus()) {
        Q_D(QTreeView);

        QAccessibleEvent event(this, QAccessible::Focus);
        event.setChild(d->accessibleTree2Index(current));
        QAccessible::updateAccessibility(&event);
    }
#endif
}